

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O2

string * __thiscall
flow::Instr::formatOne(string *__return_storage_ptr__,Instr *this,string *mnemonic)

{
  Cidr *this_00;
  undefined8 uVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  Value *pVVar4;
  long *plVar5;
  long lVar6;
  ostream *poVar7;
  IRBuiltinHandler *this_01;
  Signature *pSVar8;
  IRBuiltinFunction *this_02;
  long lVar9;
  Constant **v;
  long *plVar10;
  Constant **v_3;
  long lVar11;
  char *pcVar12;
  Family *pFVar13;
  undefined8 *puVar14;
  Cidr *pCVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long lVar16;
  bool bVar17;
  byte bVar18;
  string_view format_str;
  string_view format_str_00;
  long local_240;
  undefined1 local_228 [32];
  Cidr local_208;
  stringstream sstr;
  ostream local_1a8 [376];
  
  bVar18 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
  if ((this->super_Value).type_ == Void) {
    std::operator<<(local_1a8,(string *)mnemonic);
  }
  else {
    if ((this->super_Value).name_._M_string_length == 0) {
      format_str_00.size_ = (size_t)mnemonic;
      format_str_00.data_ = (char *)0x9;
      fmt::v5::format<std::__cxx11::string>
                ((string *)(local_228 + 0x20),(v5 *)"%??? = {}",format_str_00,in_R8);
      std::operator<<(local_1a8,(string *)(local_228 + 0x20));
    }
    else {
      format_str.size_ = (size_t)&(this->super_Value).name_;
      format_str.data_ = (char *)0x8;
      fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)(local_228 + 0x20),(v5 *)"%{} = {}",format_str,mnemonic,in_R9);
      std::operator<<(local_1a8,(string *)(local_228 + 0x20));
    }
    std::__cxx11::string::~string((string *)(local_228 + 0x20));
  }
  ppVVar2 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVVar3 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar16 = 0;
  this_00 = (Cidr *)(local_228 + 0x20);
  do {
    if (lVar16 == (long)ppVVar2 - (long)ppVVar3 >> 3) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
      return __return_storage_ptr__;
    }
    pcVar12 = ", ";
    if (lVar16 == 0) {
      pcVar12 = " ";
    }
    std::operator<<(local_1a8,pcVar12);
    pVVar4 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar16];
    if ((pVVar4 == (Value *)0x0) ||
       (lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,&Constant::typeinfo,0), lVar6 == 0)) {
LAB_00141c78:
      poVar7 = std::operator<<(local_1a8,'%');
      std::operator<<(poVar7,(string *)&pVVar4->name_);
    }
    else {
      lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,
                             &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
      if (lVar6 == 0) {
        lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,
                               &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0
                              );
        pCVar15 = this_00;
        if (lVar6 == 0) {
          lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,
                                 &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::
                                  typeinfo,0);
          if (lVar6 != 0) {
            pFVar13 = (Family *)(lVar6 + 0x48);
            for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pCVar15->ipaddr_).family_ = *pFVar13;
              pFVar13 = pFVar13 + (ulong)bVar18 * -2 + 1;
              pCVar15 = (Cidr *)((long)pCVar15 + (ulong)bVar18 * -8 + 4);
            }
            pcVar12 = util::IPAddress::c_str((IPAddress *)this_00);
            std::operator<<(local_1a8,pcVar12);
            goto LAB_00141c92;
          }
          lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,
                                 &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::typeinfo,0);
          if (lVar6 == 0) {
            lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,
                                   &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::typeinfo
                                   ,0);
            if (lVar6 != 0) {
              poVar7 = std::operator<<(local_1a8,'/');
              util::RegExp::RegExp((RegExp *)this_00,(RegExp *)(lVar6 + 0x48));
              poVar7 = std::operator<<(poVar7,(string *)this_00);
              std::operator<<(poVar7,'/');
              util::RegExp::~RegExp((RegExp *)this_00);
              goto LAB_00141c92;
            }
            this_01 = (IRBuiltinHandler *)
                      __dynamic_cast(pVVar4,&Value::typeinfo,&IRBuiltinHandler::typeinfo,0);
            if (this_01 == (IRBuiltinHandler *)0x0) {
              this_02 = (IRBuiltinFunction *)
                        __dynamic_cast(pVVar4,&Value::typeinfo,&IRBuiltinFunction::typeinfo,0);
              if (this_02 == (IRBuiltinFunction *)0x0) {
                lVar6 = __dynamic_cast(pVVar4,&Value::typeinfo,&ConstantArray::typeinfo,0);
                if (lVar6 == 0) goto LAB_00141c78;
                std::operator<<(local_1a8,'[');
                switch(*(undefined4 *)(lVar6 + 8)) {
                case 9:
                  lVar9 = *(long *)(lVar6 + 0x50);
                  lVar11 = 0;
                  for (lVar6 = *(long *)(lVar6 + 0x48); lVar6 != lVar9; lVar6 = lVar6 + 8) {
                    bVar17 = lVar11 != 0;
                    lVar11 = lVar11 + -1;
                    if (bVar17) {
                      std::operator<<(local_1a8,", ");
                    }
                    std::ostream::_M_insert<long>((long)local_1a8);
                  }
                  break;
                case 10:
                  plVar10 = *(long **)(lVar6 + 0x48);
                  plVar5 = *(long **)(lVar6 + 0x50);
                  local_240 = 0;
                  for (; plVar10 != plVar5; plVar10 = plVar10 + 1) {
                    bVar17 = local_240 != 0;
                    local_240 = local_240 + -1;
                    if (bVar17) {
                      std::operator<<(local_1a8,", ");
                    }
                    poVar7 = std::operator<<(local_1a8,'\"');
                    std::__cxx11::string::string((string *)this_00,(string *)(*plVar10 + 0x48));
                    poVar7 = std::operator<<(poVar7,(string *)this_00);
                    std::operator<<(poVar7,'\"');
                    std::__cxx11::string::~string((string *)this_00);
                  }
                  break;
                case 0xb:
                  plVar5 = *(long **)(lVar6 + 0x50);
                  lVar9 = 0;
                  for (plVar10 = *(long **)(lVar6 + 0x48); plVar10 != plVar5; plVar10 = plVar10 + 1)
                  {
                    bVar17 = lVar9 != 0;
                    lVar9 = lVar9 + -1;
                    if (bVar17) {
                      std::operator<<(local_1a8,", ");
                    }
                    pFVar13 = (Family *)(*plVar10 + 0x48);
                    pCVar15 = this_00;
                    for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
                      (pCVar15->ipaddr_).family_ = *pFVar13;
                      pFVar13 = pFVar13 + (ulong)bVar18 * -2 + 1;
                      pCVar15 = (Cidr *)((long)pCVar15 + (ulong)bVar18 * -8 + 4);
                    }
                    util::IPAddress::str_abi_cxx11_((string *)local_228,(IPAddress *)this_00);
                    std::operator<<(local_1a8,(string *)local_228);
                    std::__cxx11::string::~string((string *)local_228);
                  }
                  break;
                case 0xc:
                  plVar5 = *(long **)(lVar6 + 0x50);
                  lVar9 = 0;
                  for (plVar10 = *(long **)(lVar6 + 0x48); plVar10 != plVar5; plVar10 = plVar10 + 1)
                  {
                    bVar17 = lVar9 != 0;
                    lVar9 = lVar9 + -1;
                    if (bVar17) {
                      std::operator<<(local_1a8,", ");
                    }
                    puVar14 = (undefined8 *)(*plVar10 + 0x48);
                    pCVar15 = this_00;
                    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
                      uVar1 = *puVar14;
                      (pCVar15->ipaddr_).family_ = (int)uVar1;
                      (pCVar15->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
                      (pCVar15->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
                      (pCVar15->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
                      (pCVar15->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
                      puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
                      pCVar15 = (Cidr *)((long)pCVar15 + (ulong)bVar18 * -0x10 + 8);
                    }
                    util::Cidr::str_abi_cxx11_((string *)local_228,this_00);
                    std::operator<<(local_1a8,(string *)local_228);
                    std::__cxx11::string::~string((string *)local_228);
                  }
                  break;
                default:
                  abort();
                }
                std::operator<<(local_1a8,']');
                goto LAB_00141c92;
              }
              pSVar8 = IRBuiltinFunction::signature(this_02);
              Signature::to_s_abi_cxx11_((string *)this_00,pSVar8);
              std::operator<<(local_1a8,(string *)this_00);
            }
            else {
              pSVar8 = IRBuiltinHandler::signature(this_01);
              Signature::to_s_abi_cxx11_((string *)this_00,pSVar8);
              std::operator<<(local_1a8,(string *)this_00);
            }
          }
          else {
            puVar14 = (undefined8 *)(lVar6 + 0x48);
            for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar1 = *puVar14;
              (pCVar15->ipaddr_).family_ = (int)uVar1;
              (pCVar15->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
              (pCVar15->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
              (pCVar15->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
              (pCVar15->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              pCVar15 = (Cidr *)((long)pCVar15 + (ulong)bVar18 * -0x10 + 8);
            }
            util::Cidr::str_abi_cxx11_((string *)local_228,this_00);
            std::operator<<(local_1a8,(string *)local_228);
            pCVar15 = (Cidr *)local_228;
          }
        }
        else {
          poVar7 = std::operator<<(local_1a8,'\"');
          std::__cxx11::string::string((string *)this_00,(string *)(lVar6 + 0x48));
          poVar7 = std::operator<<(poVar7,(string *)this_00);
          std::operator<<(poVar7,'\"');
        }
        std::__cxx11::string::~string((string *)pCVar15);
      }
      else {
        std::ostream::_M_insert<long>((long)local_1a8);
      }
    }
LAB_00141c92:
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

std::string Instr::formatOne(std::string mnemonic) const {
  std::stringstream sstr;

  if (type() == LiteralType::Void)
    sstr << mnemonic;
  else if (name().empty())
    sstr << fmt::format("%??? = {}", mnemonic);
  else
    sstr << fmt::format("%{} = {}", name(), mnemonic);

  for (size_t i = 0, e = operands_.size(); i != e; ++i) {
    sstr << (i ? ", " : " ");
    Value* arg = operands_[i];
    if (dynamic_cast<Constant*>(arg)) {
      if (auto i = dynamic_cast<ConstantInt*>(arg)) {
        sstr << i->get();
        continue;
      }
      if (auto s = dynamic_cast<ConstantString*>(arg)) {
        sstr << '"' << s->get() << '"';
        continue;
      }
      if (auto ip = dynamic_cast<ConstantIP*>(arg)) {
        sstr << ip->get().c_str();
        continue;
      }
      if (auto cidr = dynamic_cast<ConstantCidr*>(arg)) {
        sstr << cidr->get().str();
        continue;
      }
      if (auto re = dynamic_cast<ConstantRegExp*>(arg)) {
        sstr << '/' << re->get().pattern() << '/';
        continue;
      }
      if (auto bh = dynamic_cast<IRBuiltinHandler*>(arg)) {
        sstr << bh->signature().to_s();
        continue;
      }
      if (auto bf = dynamic_cast<IRBuiltinFunction*>(arg)) {
        sstr << bf->signature().to_s();
        continue;
      }
      if (auto ar = dynamic_cast<ConstantArray*>(arg)) {
        sstr << '[';
        size_t i = 0;
        switch (ar->type()) {
          case LiteralType::IntArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantInt*>(v)->get();
              ++i;
            }
            break;
          case LiteralType::StringArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << '"' << static_cast<ConstantString*>(v)->get() << '"';
              ++i;
            }
            break;
          case LiteralType::IPAddrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantIP*>(v)->get().str();
              ++i;
            }
            break;
          case LiteralType::CidrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantCidr*>(v)->get().str();
              ++i;
            }
            break;
          default:
            abort();
        }
        sstr << ']';
        continue;
      }
    }
    sstr << '%' << arg->name();
  }

  // XXX sometimes u're interested in the name of the instr, even though it
  // doesn't yield a result value on the stack
  // if (type() == LiteralType::Void) {
  //   sstr << "\t; (%" << name() << ")";
  // }

  return sstr.str();
}